

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O1

float __thiscall
rlottie::internal::model::KeyFrames<float,_void>::Frame::value(Frame *this,int frameNo)

{
  float fVar1;
  float fVar2;
  
  if (this->interpolator_ == (VInterpolator *)0x0) {
    fVar2 = 0.0;
  }
  else {
    fVar2 = VInterpolator::value
                      (this->interpolator_,
                       ((float)frameNo - this->start_) / (this->end_ - this->start_));
  }
  fVar1 = (this->value_).start_;
  return ((this->value_).end_ - fVar1) * fVar2 + fVar1;
}

Assistant:

T     value(int frameNo) const { return value_.at(progress(frameNo)); }